

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

void arg_print_glossary(FILE *fp,void **argtable,char *format)

{
  arg_dstr_t ds_00;
  char *__s;
  arg_dstr_t ds;
  char *format_local;
  void **argtable_local;
  FILE *fp_local;
  
  ds_00 = arg_dstr_create();
  arg_print_glossary_ds(ds_00,argtable,format);
  __s = arg_dstr_cstr(ds_00);
  fputs(__s,(FILE *)fp);
  arg_dstr_destroy(ds_00);
  return;
}

Assistant:

void arg_print_glossary(FILE* fp, void** argtable, const char* format) {
    arg_dstr_t ds = arg_dstr_create();
    arg_print_glossary_ds(ds, argtable, format);
    fputs(arg_dstr_cstr(ds), fp);
    arg_dstr_destroy(ds);
}